

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkGetClauseNum(Abc_Ntk_t *pNtk)

{
  DdManager *dd;
  void *pvVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  DdNode *n;
  DdNode *pDVar5;
  long lVar6;
  int iVar7;
  DdNode *zCover;
  DdNode *local_40;
  Abc_Ntk_t *local_38;
  
  if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    pVVar4 = pNtk->vObjs;
    if (pVVar4->nSize < 1) {
      iVar7 = 0;
    }
    else {
      dd = (DdManager *)pNtk->pManFunc;
      lVar6 = 0;
      iVar7 = 0;
      local_38 = pNtk;
      do {
        pvVar1 = pVVar4->pArray[lVar6];
        if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7)) {
          pDVar5 = *(DdNode **)((long)pvVar1 + 0x38);
          if (pDVar5 == (DdNode *)0x0) {
            __assert_fail("pNode->pData",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                          ,0x139,"int Abc_NtkGetClauseNum(Abc_Ntk_t *)");
          }
          n = Cudd_zddIsop(dd,pDVar5,pDVar5,&local_40);
          Cudd_Ref(n);
          Cudd_Ref(local_40);
          iVar2 = Abc_CountZddCubes(dd,local_40);
          Cudd_RecursiveDeref(dd,n);
          Cudd_RecursiveDerefZdd(dd,local_40);
          pDVar5 = Cudd_zddIsop(dd,(DdNode *)((ulong)pDVar5 ^ 1),(DdNode *)((ulong)pDVar5 ^ 1),
                                &local_40);
          Cudd_Ref(pDVar5);
          Cudd_Ref(local_40);
          iVar3 = Abc_CountZddCubes(dd,local_40);
          iVar7 = iVar3 + iVar2 + iVar7;
          Cudd_RecursiveDeref(dd,pDVar5);
          Cudd_RecursiveDerefZdd(dd,local_40);
          pNtk = local_38;
        }
        lVar6 = lVar6 + 1;
        pVVar4 = pNtk->vObjs;
      } while (lVar6 < pVVar4->nSize);
    }
    return iVar7;
  }
  __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                ,0x136,"int Abc_NtkGetClauseNum(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkGetClauseNum( Abc_Ntk_t * pNtk )
{
    int nClauses = 0;
#ifdef ABC_USE_CUDD
    extern int Abc_CountZddCubes( DdManager * dd, DdNode * zCover );
    Abc_Obj_t * pNode;
    DdNode * bCover, * zCover, * bFunc;
    DdManager * dd = (DdManager *)pNtk->pManFunc;
    int i;
    assert( Abc_NtkIsBddLogic(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        assert( pNode->pData );
        bFunc = (DdNode *)pNode->pData;

        bCover = Cudd_zddIsop( dd, bFunc, bFunc, &zCover );  
        Cudd_Ref( bCover );
        Cudd_Ref( zCover );
        nClauses += Abc_CountZddCubes( dd, zCover );
        Cudd_RecursiveDeref( dd, bCover );
        Cudd_RecursiveDerefZdd( dd, zCover );

        bCover = Cudd_zddIsop( dd, Cudd_Not(bFunc), Cudd_Not(bFunc), &zCover );  
        Cudd_Ref( bCover );
        Cudd_Ref( zCover );
        nClauses += Abc_CountZddCubes( dd, zCover );
        Cudd_RecursiveDeref( dd, bCover );
        Cudd_RecursiveDerefZdd( dd, zCover );
    }
#endif
    return nClauses;
}